

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Vector4 Vector4Normalize(Vector4 v)

{
  float fVar1;
  float fVar3;
  undefined8 uVar2;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector4 VVar7;
  
  fVar5 = v.z;
  fVar4 = v.w;
  fVar1 = v.x;
  fVar3 = v.y;
  fVar6 = SQRT(fVar4 * fVar4 + fVar5 * fVar5 + fVar1 * fVar1 + fVar3 * fVar3);
  if (0.0 < fVar6) {
    fVar6 = 1.0 / fVar6;
    uVar2 = CONCAT44(fVar3 * fVar6,fVar1 * fVar6);
    fVar5 = fVar6 * fVar5;
    fVar6 = fVar6 * fVar4;
  }
  else {
    uVar2 = 0;
    fVar5 = 0.0;
    fVar6 = 0.0;
  }
  VVar7.w = fVar6;
  VVar7.z = fVar5;
  VVar7.x = (float)(int)uVar2;
  VVar7.y = (float)(int)((ulong)uVar2 >> 0x20);
  return VVar7;
}

Assistant:

RMAPI Vector4 Vector4Normalize(Vector4 v)
{
    Vector4 result = { 0 };
    float length = sqrtf((v.x*v.x) + (v.y*v.y) + (v.z*v.z) + (v.w*v.w));

    if (length > 0)
    {
        float ilength = 1.0f/length;
        result.x = v.x*ilength;
        result.y = v.y*ilength;
        result.z = v.z*ilength;
        result.w = v.w*ilength;
    }

    return result;
}